

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O2

void inproc_ep_close(void *arg)

{
  int iVar1;
  void *item;
  nni_aio *pnVar2;
  
  nni_mtx_lock(&nni_inproc.mx);
  iVar1 = nni_list_active(&nni_inproc.servers,arg);
  if (iVar1 != 0) {
    nni_list_remove(&nni_inproc.servers,arg);
  }
  while( true ) {
    item = nni_list_first((nni_list *)((long)arg + 0x68));
    if (item == (void *)0x0) break;
    while( true ) {
      pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)item + 0x80));
      if (pnVar2 == (nni_aio *)0x0) break;
      inproc_conn_finish(pnVar2,6,(inproc_ep *)arg,(inproc_pipe *)0x0);
    }
    nni_list_remove((nni_list *)((long)arg + 0x68),item);
  }
  while( true ) {
    pnVar2 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x80));
    if (pnVar2 == (nni_aio *)0x0) break;
    inproc_conn_finish(pnVar2,7,(inproc_ep *)arg,(inproc_pipe *)0x0);
  }
  nni_mtx_unlock(&nni_inproc.mx);
  return;
}

Assistant:

static void
inproc_ep_close(void *arg)
{
	inproc_ep *ep = arg;
	inproc_ep *client;
	nni_aio   *aio;

	nni_mtx_lock(&nni_inproc.mx);
	if (nni_list_active(&nni_inproc.servers, ep)) {
		nni_list_remove(&nni_inproc.servers, ep);
	}
	// Notify any waiting clients that we are closed.
	while ((client = nni_list_first(&ep->clients)) != NULL) {
		while ((aio = nni_list_first(&client->aios)) != NULL) {
			inproc_conn_finish(aio, NNG_ECONNREFUSED, ep, NULL);
		}
		nni_list_remove(&ep->clients, client);
	}
	while ((aio = nni_list_first(&ep->aios)) != NULL) {
		inproc_conn_finish(aio, NNG_ECLOSED, ep, NULL);
	}
	nni_mtx_unlock(&nni_inproc.mx);
}